

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration.h
# Opt level: O0

void __thiscall
wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
          (AbstractChildIterator<wasm::ChildIterator> *this,Expression *parent)

{
  Block *pBVar1;
  If *pIVar2;
  Loop *pLVar3;
  Break *pBVar4;
  Switch *pSVar5;
  Call *pCVar6;
  CallIndirect *pCVar7;
  LocalSet *pLVar8;
  GlobalSet *pGVar9;
  Load *pLVar10;
  Store *pSVar11;
  AtomicRMW *pAVar12;
  AtomicCmpxchg *pAVar13;
  AtomicWait *pAVar14;
  AtomicNotify *pAVar15;
  SIMDExtract *pSVar16;
  SIMDReplace *pSVar17;
  SIMDShuffle *pSVar18;
  SIMDTernary *pSVar19;
  SIMDShift *pSVar20;
  SIMDLoad *pSVar21;
  SIMDLoadStoreLane *pSVar22;
  MemoryInit *pMVar23;
  MemoryCopy *pMVar24;
  MemoryFill *pMVar25;
  Unary *pUVar26;
  Binary *pBVar27;
  Select *pSVar28;
  Drop *pDVar29;
  Return *pRVar30;
  MemoryGrow *pMVar31;
  RefIsNull *pRVar32;
  RefEq *pRVar33;
  TableGet *pTVar34;
  TableSet *pTVar35;
  TableGrow *pTVar36;
  Try *pTVar37;
  Throw *pTVar38;
  TupleMake *pTVar39;
  TupleExtract *pTVar40;
  I31New *pIVar41;
  I31Get *pIVar42;
  CallRef *pCVar43;
  RefTest *pRVar44;
  RefCast *pRVar45;
  BrOn *pBVar46;
  StructNew *pSVar47;
  StructGet *pSVar48;
  StructSet *pSVar49;
  ArrayNew *pAVar50;
  ArrayNewSeg *pAVar51;
  ArrayNewFixed *pAVar52;
  size_t sVar53;
  Expression **ppEVar54;
  ArrayGet *pAVar55;
  ArraySet *pAVar56;
  ArrayLen *pAVar57;
  ArrayCopy *pAVar58;
  ArrayFill *pAVar59;
  ArrayInit *pAVar60;
  RefAs *pRVar61;
  StringNew *pSVar62;
  StringMeasure *pSVar63;
  StringEncode *pSVar64;
  StringConcat *pSVar65;
  StringEq *pSVar66;
  StringAs *pSVar67;
  StringWTF8Advance *pSVar68;
  StringWTF16Get *pSVar69;
  StringIterNext *pSVar70;
  StringIterMove *pSVar71;
  StringSliceWTF *pSVar72;
  StringSliceIter *pSVar73;
  StringSliceIter *cast_84;
  StringSliceWTF *cast_83;
  StringIterMove *cast_82;
  StringIterNext *cast_81;
  StringWTF16Get *cast_80;
  StringWTF8Advance *cast_79;
  StringAs *cast_78;
  StringEq *cast_77;
  StringConcat *cast_76;
  StringEncode *cast_75;
  StringMeasure *cast_74;
  StringConst *cast_73;
  StringNew *cast_72;
  RefAs *cast_71;
  ArrayInit *cast_70;
  ArrayFill *cast_69;
  ArrayCopy *cast_68;
  ArrayLen *cast_67;
  ArraySet *cast_66;
  ArrayGet *cast_65;
  int i_8;
  ArrayNewFixed *cast_64;
  ArrayNewSeg *cast_63;
  ArrayNew *cast_62;
  StructSet *cast_61;
  StructGet *cast_60;
  int i_7;
  StructNew *cast_59;
  BrOn *cast_58;
  RefCast *cast_57;
  RefTest *cast_56;
  int i_6;
  CallRef *cast_55;
  I31Get *cast_54;
  I31New *cast_53;
  TupleExtract *cast_52;
  int i_5;
  TupleMake *cast_51;
  Pop *cast_50;
  Unreachable *cast_49;
  Nop *cast_48;
  Rethrow *cast_47;
  int i_4;
  Throw *cast_46;
  int i_3;
  Try *cast_45;
  TableGrow *cast_44;
  TableSize *cast_43;
  TableSet *cast_42;
  TableGet *cast_41;
  RefEq *cast_40;
  RefFunc *cast_39;
  RefIsNull *cast_38;
  RefNull *cast_37;
  MemoryGrow *cast_36;
  MemorySize *cast_35;
  Return *cast_34;
  Drop *cast_33;
  Select *cast_32;
  Binary *cast_31;
  Unary *cast_30;
  Const *cast_29;
  MemoryFill *cast_28;
  MemoryCopy *cast_27;
  DataDrop *cast_26;
  MemoryInit *cast_25;
  SIMDLoadStoreLane *cast_24;
  SIMDLoad *cast_23;
  SIMDShift *cast_22;
  SIMDTernary *cast_21;
  SIMDShuffle *cast_20;
  SIMDReplace *cast_19;
  SIMDExtract *cast_18;
  AtomicFence *cast_17;
  AtomicNotify *cast_16;
  AtomicWait *cast_15;
  AtomicCmpxchg *cast_14;
  AtomicRMW *cast_13;
  Store *cast_12;
  Load *cast_11;
  GlobalSet *cast_10;
  GlobalGet *cast_9;
  LocalSet *cast_8;
  LocalGet *cast_7;
  int i_2;
  CallIndirect *cast_6;
  int i_1;
  Call *cast_5;
  Switch *cast_4;
  Break *cast_3;
  Loop *cast_2;
  If *cast_1;
  int i;
  Block *cast;
  ChildIterator *self;
  Expression *parent_local;
  AbstractChildIterator<wasm::ChildIterator> *this_local;
  
  SmallVector<wasm::Expression_**,_4UL>::SmallVector(&this->children);
  switch(parent->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
               ,0xb0);
  case BlockId:
    pBVar1 = Expression::cast<wasm::Block>(parent);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pBVar1->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_1._4_4_ = (int)sVar53;
    while (cast_1._4_4_ = cast_1._4_4_ + -1, -1 < cast_1._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_1._4_4_);
      addChild(this,parent,ppEVar54);
    }
    break;
  case IfId:
    pIVar2 = Expression::cast<wasm::If>(parent);
    if (*(long *)(pIVar2 + 0x20) != 0) {
      addChild(this,parent,(Expression **)(pIVar2 + 0x20));
    }
    addChild(this,parent,(Expression **)(pIVar2 + 0x18));
    addChild(this,parent,(Expression **)(pIVar2 + 0x10));
    break;
  case LoopId:
    pLVar3 = Expression::cast<wasm::Loop>(parent);
    addChild(this,parent,(Expression **)(pLVar3 + 0x20));
    break;
  case BreakId:
    pBVar4 = Expression::cast<wasm::Break>(parent);
    if (*(long *)(pBVar4 + 0x28) != 0) {
      addChild(this,parent,(Expression **)(pBVar4 + 0x28));
    }
    if (*(long *)(pBVar4 + 0x20) != 0) {
      addChild(this,parent,(Expression **)(pBVar4 + 0x20));
    }
    break;
  case SwitchId:
    pSVar5 = Expression::cast<wasm::Switch>(parent);
    addChild(this,parent,(Expression **)(pSVar5 + 0x48));
    if (*(long *)(pSVar5 + 0x40) != 0) {
      addChild(this,parent,(Expression **)(pSVar5 + 0x40));
    }
    break;
  case CallId:
    pCVar6 = Expression::cast<wasm::Call>(parent);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar6 + 0x10));
    cast_6._4_4_ = (int)sVar53;
    while (cast_6._4_4_ = cast_6._4_4_ + -1, -1 < cast_6._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar6 + 0x10),(long)cast_6._4_4_);
      addChild(this,parent,ppEVar54);
    }
    break;
  case CallIndirectId:
    pCVar7 = Expression::cast<wasm::CallIndirect>(parent);
    addChild(this,parent,(Expression **)(pCVar7 + 0x38));
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar7 + 0x18));
    cast_7._4_4_ = (int)sVar53;
    while (cast_7._4_4_ = cast_7._4_4_ + -1, -1 < cast_7._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar7 + 0x18),(long)cast_7._4_4_);
      addChild(this,parent,ppEVar54);
    }
    break;
  case LocalGetId:
    Expression::cast<wasm::LocalGet>(parent);
    break;
  case LocalSetId:
    pLVar8 = Expression::cast<wasm::LocalSet>(parent);
    addChild(this,parent,(Expression **)(pLVar8 + 0x18));
    break;
  case GlobalGetId:
    Expression::cast<wasm::GlobalGet>(parent);
    break;
  case GlobalSetId:
    pGVar9 = Expression::cast<wasm::GlobalSet>(parent);
    addChild(this,parent,(Expression **)(pGVar9 + 0x20));
    break;
  case LoadId:
    pLVar10 = Expression::cast<wasm::Load>(parent);
    addChild(this,parent,(Expression **)(pLVar10 + 0x30));
    break;
  case StoreId:
    pSVar11 = Expression::cast<wasm::Store>(parent);
    addChild(this,parent,(Expression **)(pSVar11 + 0x38));
    addChild(this,parent,(Expression **)(pSVar11 + 0x30));
    break;
  case ConstId:
    Expression::cast<wasm::Const>(parent);
    break;
  case UnaryId:
    pUVar26 = Expression::cast<wasm::Unary>(parent);
    addChild(this,parent,&pUVar26->value);
    break;
  case BinaryId:
    pBVar27 = Expression::cast<wasm::Binary>(parent);
    addChild(this,parent,(Expression **)(pBVar27 + 0x20));
    addChild(this,parent,(Expression **)(pBVar27 + 0x18));
    break;
  case SelectId:
    pSVar28 = Expression::cast<wasm::Select>(parent);
    addChild(this,parent,(Expression **)(pSVar28 + 0x20));
    addChild(this,parent,(Expression **)(pSVar28 + 0x18));
    addChild(this,parent,(Expression **)(pSVar28 + 0x10));
    break;
  case DropId:
    pDVar29 = Expression::cast<wasm::Drop>(parent);
    addChild(this,parent,&pDVar29->value);
    break;
  case ReturnId:
    pRVar30 = Expression::cast<wasm::Return>(parent);
    if (*(long *)(pRVar30 + 0x10) != 0) {
      addChild(this,parent,(Expression **)(pRVar30 + 0x10));
    }
    break;
  case MemorySizeId:
    Expression::cast<wasm::MemorySize>(parent);
    break;
  case MemoryGrowId:
    pMVar31 = Expression::cast<wasm::MemoryGrow>(parent);
    addChild(this,parent,(Expression **)(pMVar31 + 0x10));
    break;
  case NopId:
    Expression::cast<wasm::Nop>(parent);
    break;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(parent);
    break;
  case AtomicRMWId:
    pAVar12 = Expression::cast<wasm::AtomicRMW>(parent);
    addChild(this,parent,(Expression **)(pAVar12 + 0x28));
    addChild(this,parent,(Expression **)(pAVar12 + 0x20));
    break;
  case AtomicCmpxchgId:
    pAVar13 = Expression::cast<wasm::AtomicCmpxchg>(parent);
    addChild(this,parent,(Expression **)(pAVar13 + 0x30));
    addChild(this,parent,(Expression **)(pAVar13 + 0x28));
    addChild(this,parent,(Expression **)(pAVar13 + 0x20));
    break;
  case AtomicWaitId:
    pAVar14 = Expression::cast<wasm::AtomicWait>(parent);
    addChild(this,parent,(Expression **)(pAVar14 + 0x28));
    addChild(this,parent,(Expression **)(pAVar14 + 0x20));
    addChild(this,parent,(Expression **)(pAVar14 + 0x18));
    break;
  case AtomicNotifyId:
    pAVar15 = Expression::cast<wasm::AtomicNotify>(parent);
    addChild(this,parent,(Expression **)(pAVar15 + 0x20));
    addChild(this,parent,(Expression **)(pAVar15 + 0x18));
    break;
  case AtomicFenceId:
    Expression::cast<wasm::AtomicFence>(parent);
    break;
  case SIMDExtractId:
    pSVar16 = Expression::cast<wasm::SIMDExtract>(parent);
    addChild(this,parent,(Expression **)(pSVar16 + 0x18));
    break;
  case SIMDReplaceId:
    pSVar17 = Expression::cast<wasm::SIMDReplace>(parent);
    addChild(this,parent,(Expression **)(pSVar17 + 0x28));
    addChild(this,parent,(Expression **)(pSVar17 + 0x18));
    break;
  case SIMDShuffleId:
    pSVar18 = Expression::cast<wasm::SIMDShuffle>(parent);
    addChild(this,parent,(Expression **)(pSVar18 + 0x18));
    addChild(this,parent,(Expression **)(pSVar18 + 0x10));
    break;
  case SIMDTernaryId:
    pSVar19 = Expression::cast<wasm::SIMDTernary>(parent);
    addChild(this,parent,(Expression **)(pSVar19 + 0x28));
    addChild(this,parent,(Expression **)(pSVar19 + 0x20));
    addChild(this,parent,(Expression **)(pSVar19 + 0x18));
    break;
  case SIMDShiftId:
    pSVar20 = Expression::cast<wasm::SIMDShift>(parent);
    addChild(this,parent,(Expression **)(pSVar20 + 0x20));
    addChild(this,parent,(Expression **)(pSVar20 + 0x18));
    break;
  case SIMDLoadId:
    pSVar21 = Expression::cast<wasm::SIMDLoad>(parent);
    addChild(this,parent,(Expression **)(pSVar21 + 0x28));
    break;
  case SIMDLoadStoreLaneId:
    pSVar22 = Expression::cast<wasm::SIMDLoadStoreLane>(parent);
    addChild(this,parent,(Expression **)(pSVar22 + 0x38));
    addChild(this,parent,(Expression **)(pSVar22 + 0x30));
    break;
  case MemoryInitId:
    pMVar23 = Expression::cast<wasm::MemoryInit>(parent);
    addChild(this,parent,(Expression **)(pMVar23 + 0x30));
    addChild(this,parent,(Expression **)(pMVar23 + 0x28));
    addChild(this,parent,(Expression **)(pMVar23 + 0x20));
    break;
  case DataDropId:
    Expression::cast<wasm::DataDrop>(parent);
    break;
  case MemoryCopyId:
    pMVar24 = Expression::cast<wasm::MemoryCopy>(parent);
    addChild(this,parent,(Expression **)(pMVar24 + 0x20));
    addChild(this,parent,(Expression **)(pMVar24 + 0x18));
    addChild(this,parent,(Expression **)(pMVar24 + 0x10));
    break;
  case MemoryFillId:
    pMVar25 = Expression::cast<wasm::MemoryFill>(parent);
    addChild(this,parent,(Expression **)(pMVar25 + 0x20));
    addChild(this,parent,(Expression **)(pMVar25 + 0x18));
    addChild(this,parent,(Expression **)(pMVar25 + 0x10));
    break;
  case PopId:
    Expression::cast<wasm::Pop>(parent);
    break;
  case RefNullId:
    Expression::cast<wasm::RefNull>(parent);
    break;
  case RefIsNullId:
    pRVar32 = Expression::cast<wasm::RefIsNull>(parent);
    addChild(this,parent,(Expression **)(pRVar32 + 0x10));
    break;
  case RefFuncId:
    Expression::cast<wasm::RefFunc>(parent);
    break;
  case RefEqId:
    pRVar33 = Expression::cast<wasm::RefEq>(parent);
    addChild(this,parent,(Expression **)(pRVar33 + 0x18));
    addChild(this,parent,(Expression **)(pRVar33 + 0x10));
    break;
  case TableGetId:
    pTVar34 = Expression::cast<wasm::TableGet>(parent);
    addChild(this,parent,(Expression **)(pTVar34 + 0x20));
    break;
  case TableSetId:
    pTVar35 = Expression::cast<wasm::TableSet>(parent);
    addChild(this,parent,(Expression **)(pTVar35 + 0x28));
    addChild(this,parent,(Expression **)(pTVar35 + 0x20));
    break;
  case TableSizeId:
    Expression::cast<wasm::TableSize>(parent);
    break;
  case TableGrowId:
    pTVar36 = Expression::cast<wasm::TableGrow>(parent);
    addChild(this,parent,(Expression **)(pTVar36 + 0x28));
    addChild(this,parent,(Expression **)(pTVar36 + 0x20));
    break;
  case TryId:
    pTVar37 = Expression::cast<wasm::Try>(parent);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pTVar37 + 0x48));
    cast_46._4_4_ = (int)sVar53;
    while (cast_46._4_4_ = cast_46._4_4_ + -1, -1 < cast_46._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar37 + 0x48),(long)cast_46._4_4_);
      addChild(this,parent,ppEVar54);
    }
    addChild(this,parent,(Expression **)(pTVar37 + 0x20));
    break;
  case ThrowId:
    pTVar38 = Expression::cast<wasm::Throw>(parent);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pTVar38 + 0x20));
    cast_47._4_4_ = (int)sVar53;
    while (cast_47._4_4_ = cast_47._4_4_ + -1, -1 < cast_47._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar38 + 0x20),(long)cast_47._4_4_);
      addChild(this,parent,ppEVar54);
    }
    break;
  case RethrowId:
    Expression::cast<wasm::Rethrow>(parent);
    break;
  case TupleMakeId:
    pTVar39 = Expression::cast<wasm::TupleMake>(parent);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar39->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_52._4_4_ = (int)sVar53;
    while (cast_52._4_4_ = cast_52._4_4_ + -1, -1 < cast_52._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar39->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_52._4_4_);
      addChild(this,parent,ppEVar54);
    }
    break;
  case TupleExtractId:
    pTVar40 = Expression::cast<wasm::TupleExtract>(parent);
    addChild(this,parent,(Expression **)(pTVar40 + 0x10));
    break;
  case I31NewId:
    pIVar41 = Expression::cast<wasm::I31New>(parent);
    addChild(this,parent,&pIVar41->value);
    break;
  case I31GetId:
    pIVar42 = Expression::cast<wasm::I31Get>(parent);
    addChild(this,parent,(Expression **)(pIVar42 + 0x10));
    break;
  case CallRefId:
    pCVar43 = Expression::cast<wasm::CallRef>(parent);
    addChild(this,parent,(Expression **)(pCVar43 + 0x30));
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar43 + 0x10));
    cast_56._4_4_ = (int)sVar53;
    while (cast_56._4_4_ = cast_56._4_4_ + -1, -1 < cast_56._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar43 + 0x10),(long)cast_56._4_4_);
      addChild(this,parent,ppEVar54);
    }
    break;
  case RefTestId:
    pRVar44 = Expression::cast<wasm::RefTest>(parent);
    addChild(this,parent,(Expression **)(pRVar44 + 0x10));
    break;
  case RefCastId:
    pRVar45 = Expression::cast<wasm::RefCast>(parent);
    addChild(this,parent,(Expression **)(pRVar45 + 0x10));
    break;
  case BrOnId:
    pBVar46 = Expression::cast<wasm::BrOn>(parent);
    addChild(this,parent,(Expression **)(pBVar46 + 0x28));
    break;
  case StructNewId:
    pSVar47 = Expression::cast<wasm::StructNew>(parent);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar47 + 0x10));
    cast_60._4_4_ = (int)sVar53;
    while (cast_60._4_4_ = cast_60._4_4_ + -1, -1 < cast_60._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pSVar47 + 0x10),(long)cast_60._4_4_);
      addChild(this,parent,ppEVar54);
    }
    break;
  case StructGetId:
    pSVar48 = Expression::cast<wasm::StructGet>(parent);
    addChild(this,parent,(Expression **)(pSVar48 + 0x18));
    break;
  case StructSetId:
    pSVar49 = Expression::cast<wasm::StructSet>(parent);
    addChild(this,parent,(Expression **)(pSVar49 + 0x20));
    addChild(this,parent,(Expression **)(pSVar49 + 0x18));
    break;
  case ArrayNewId:
    pAVar50 = Expression::cast<wasm::ArrayNew>(parent);
    addChild(this,parent,(Expression **)(pAVar50 + 0x18));
    if (*(long *)(pAVar50 + 0x10) != 0) {
      addChild(this,parent,(Expression **)(pAVar50 + 0x10));
    }
    break;
  case ArrayNewSegId:
    pAVar51 = Expression::cast<wasm::ArrayNewSeg>(parent);
    addChild(this,parent,(Expression **)(pAVar51 + 0x30));
    addChild(this,parent,(Expression **)(pAVar51 + 0x28));
    break;
  case ArrayNewFixedId:
    pAVar52 = Expression::cast<wasm::ArrayNewFixed>(parent);
    sVar53 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pAVar52 + 0x10));
    cast_65._4_4_ = (int)sVar53;
    while (cast_65._4_4_ = cast_65._4_4_ + -1, -1 < cast_65._4_4_) {
      ppEVar54 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pAVar52 + 0x10),(long)cast_65._4_4_);
      addChild(this,parent,ppEVar54);
    }
    break;
  case ArrayGetId:
    pAVar55 = Expression::cast<wasm::ArrayGet>(parent);
    addChild(this,parent,(Expression **)(pAVar55 + 0x18));
    addChild(this,parent,(Expression **)(pAVar55 + 0x10));
    break;
  case ArraySetId:
    pAVar56 = Expression::cast<wasm::ArraySet>(parent);
    addChild(this,parent,(Expression **)(pAVar56 + 0x20));
    addChild(this,parent,(Expression **)(pAVar56 + 0x18));
    addChild(this,parent,(Expression **)(pAVar56 + 0x10));
    break;
  case ArrayLenId:
    pAVar57 = Expression::cast<wasm::ArrayLen>(parent);
    addChild(this,parent,(Expression **)(pAVar57 + 0x10));
    break;
  case ArrayCopyId:
    pAVar58 = Expression::cast<wasm::ArrayCopy>(parent);
    addChild(this,parent,(Expression **)(pAVar58 + 0x30));
    addChild(this,parent,(Expression **)(pAVar58 + 0x28));
    addChild(this,parent,(Expression **)(pAVar58 + 0x20));
    addChild(this,parent,(Expression **)(pAVar58 + 0x18));
    addChild(this,parent,(Expression **)(pAVar58 + 0x10));
    break;
  case ArrayFillId:
    pAVar59 = Expression::cast<wasm::ArrayFill>(parent);
    addChild(this,parent,(Expression **)(pAVar59 + 0x28));
    addChild(this,parent,(Expression **)(pAVar59 + 0x20));
    addChild(this,parent,(Expression **)(pAVar59 + 0x18));
    addChild(this,parent,(Expression **)(pAVar59 + 0x10));
    break;
  case ArrayInitId:
    pAVar60 = Expression::cast<wasm::ArrayInit>(parent);
    addChild(this,parent,(Expression **)(pAVar60 + 0x40));
    addChild(this,parent,(Expression **)(pAVar60 + 0x38));
    addChild(this,parent,(Expression **)(pAVar60 + 0x30));
    addChild(this,parent,(Expression **)(pAVar60 + 0x28));
    break;
  case RefAsId:
    pRVar61 = Expression::cast<wasm::RefAs>(parent);
    addChild(this,parent,&pRVar61->value);
    break;
  case StringNewId:
    pSVar62 = Expression::cast<wasm::StringNew>(parent);
    if (*(long *)(pSVar62 + 0x30) != 0) {
      addChild(this,parent,(Expression **)(pSVar62 + 0x30));
    }
    if (*(long *)(pSVar62 + 0x28) != 0) {
      addChild(this,parent,(Expression **)(pSVar62 + 0x28));
    }
    if (*(long *)(pSVar62 + 0x20) != 0) {
      addChild(this,parent,(Expression **)(pSVar62 + 0x20));
    }
    addChild(this,parent,(Expression **)(pSVar62 + 0x18));
    break;
  case StringConstId:
    Expression::cast<wasm::StringConst>(parent);
    break;
  case StringMeasureId:
    pSVar63 = Expression::cast<wasm::StringMeasure>(parent);
    addChild(this,parent,(Expression **)(pSVar63 + 0x18));
    break;
  case StringEncodeId:
    pSVar64 = Expression::cast<wasm::StringEncode>(parent);
    if (*(long *)(pSVar64 + 0x28) != 0) {
      addChild(this,parent,(Expression **)(pSVar64 + 0x28));
    }
    addChild(this,parent,(Expression **)(pSVar64 + 0x20));
    addChild(this,parent,(Expression **)(pSVar64 + 0x18));
    break;
  case StringConcatId:
    pSVar65 = Expression::cast<wasm::StringConcat>(parent);
    addChild(this,parent,(Expression **)(pSVar65 + 0x18));
    addChild(this,parent,(Expression **)(pSVar65 + 0x10));
    break;
  case StringEqId:
    pSVar66 = Expression::cast<wasm::StringEq>(parent);
    addChild(this,parent,(Expression **)(pSVar66 + 0x20));
    addChild(this,parent,(Expression **)(pSVar66 + 0x18));
    break;
  case StringAsId:
    pSVar67 = Expression::cast<wasm::StringAs>(parent);
    addChild(this,parent,(Expression **)(pSVar67 + 0x18));
    break;
  case StringWTF8AdvanceId:
    pSVar68 = Expression::cast<wasm::StringWTF8Advance>(parent);
    addChild(this,parent,(Expression **)(pSVar68 + 0x20));
    addChild(this,parent,(Expression **)(pSVar68 + 0x18));
    addChild(this,parent,(Expression **)(pSVar68 + 0x10));
    break;
  case StringWTF16GetId:
    pSVar69 = Expression::cast<wasm::StringWTF16Get>(parent);
    addChild(this,parent,(Expression **)(pSVar69 + 0x18));
    addChild(this,parent,(Expression **)(pSVar69 + 0x10));
    break;
  case StringIterNextId:
    pSVar70 = Expression::cast<wasm::StringIterNext>(parent);
    addChild(this,parent,(Expression **)(pSVar70 + 0x10));
    break;
  case StringIterMoveId:
    pSVar71 = Expression::cast<wasm::StringIterMove>(parent);
    addChild(this,parent,(Expression **)(pSVar71 + 0x20));
    addChild(this,parent,(Expression **)(pSVar71 + 0x18));
    break;
  case StringSliceWTFId:
    pSVar72 = Expression::cast<wasm::StringSliceWTF>(parent);
    addChild(this,parent,(Expression **)(pSVar72 + 0x28));
    addChild(this,parent,(Expression **)(pSVar72 + 0x20));
    addChild(this,parent,(Expression **)(pSVar72 + 0x18));
    break;
  case StringSliceIterId:
    pSVar73 = Expression::cast<wasm::StringSliceIter>(parent);
    addChild(this,parent,(Expression **)(pSVar73 + 0x18));
    addChild(this,parent,(Expression **)(pSVar73 + 0x10));
  }
  return;
}

Assistant:

AbstractChildIterator(Expression* parent) {
    auto* self = (Specific*)this;

#define DELEGATE_ID parent->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = parent->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field) self->addChild(parent, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  if (cast->field) {                                                           \
    self->addChild(parent, &cast->field);                                      \
  }

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }